

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void page_table_config_init(uc_struct_conflict15 *uc)

{
  uint32_t v_l1_bits;
  uc_struct_conflict15 *uc_local;
  
  uc->v_l1_size = 0x100;
  uc->v_l1_shift = 10;
  uc->v_l2_levels = uc->v_l1_shift / 10 + -1;
  if (uc->v_l1_shift % 10 != 0) {
    __assert_fail("uc->v_l1_shift % V_L2_BITS == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                  ,0xb7,"void page_table_config_init(struct uc_struct *)");
  }
  if (-1 < uc->v_l2_levels) {
    return;
  }
  __assert_fail("uc->v_l2_levels >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                ,0xb8,"void page_table_config_init(struct uc_struct *)");
}

Assistant:

static void page_table_config_init(struct uc_struct *uc)
{
    uint32_t v_l1_bits;

    assert(TARGET_PAGE_BITS);
    /* The bits remaining after N lower levels of page tables.  */
    v_l1_bits = (L1_MAP_ADDR_SPACE_BITS - TARGET_PAGE_BITS) % V_L2_BITS;
    if (v_l1_bits < V_L1_MIN_BITS) {
        v_l1_bits += V_L2_BITS;
    }

    uc->v_l1_size = 1 << v_l1_bits;
    uc->v_l1_shift = L1_MAP_ADDR_SPACE_BITS - TARGET_PAGE_BITS - v_l1_bits;
    uc->v_l2_levels = uc->v_l1_shift / V_L2_BITS - 1;

    assert(v_l1_bits <= V_L1_MAX_BITS);
    assert(uc->v_l1_shift % V_L2_BITS == 0);
    assert(uc->v_l2_levels >= 0);
}